

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_tuple_primitive_uncheckedByteSlotAtPut
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  size_t slotIndex;
  sysbvm_context_t *context_00;
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  slotIndex = arguments[1] >> 4;
  if ((arguments[1] & 0xf) == 0) {
    slotIndex = 0;
  }
  context_00 = (sysbvm_context_t *)0x0;
  if ((arguments[2] & 0xf) != 0) {
    context_00 = (sysbvm_context_t *)(ulong)((uint)(arguments[2] >> 4) & 0xfffffff);
  }
  sysbvm_tuple_byteSlotAtPut(context_00,*arguments,slotIndex,(uint8_t)context_00);
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_uncheckedByteSlotAtPut(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);

    sysbvm_tuple_byteSlotAtPut(context, arguments[0], sysbvm_tuple_anySize_decode(arguments[1]), (uint8_t)sysbvm_tuple_anySize_decode(arguments[2]));
    return SYSBVM_VOID_TUPLE;
}